

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTestGroup::init
          (VertexArrayObjectTestGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined3 uVar25;
  GLint GVar26;
  GLint GVar27;
  GLboolean GVar28;
  undefined3 uVar29;
  GLboolean GVar30;
  undefined3 uVar31;
  GLint GVar32;
  GLint GVar33;
  GLenum GVar34;
  int iVar35;
  int iVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  TestNode *pTVar39;
  int extraout_EAX;
  pointer pAVar40;
  pointer pAVar41;
  VertexArrayObjectTest *pVVar42;
  MultiVertexArrayObjectTest *this_00;
  value_type *pvVar43;
  value_type *pvVar44;
  pointer pAVar45;
  pointer pAVar46;
  value_type *pvVar47;
  Attribute *__cur_1;
  Attribute *__cur;
  ulong uVar48;
  value_type *pvVar49;
  ulong uVar50;
  pointer pAVar51;
  VertexArrayState state;
  pointer local_188;
  pointer local_178;
  undefined1 local_170 [20];
  undefined8 uStack_15c;
  int iStack_154;
  undefined1 local_150 [16];
  pointer local_140;
  int local_138;
  undefined1 local_130 [16];
  pointer local_120;
  int local_118;
  undefined1 local_110 [16];
  pointer local_100;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined4 local_e0;
  TestNode *local_d8;
  value_type local_d0;
  value_type local_a8;
  undefined1 local_80 [12];
  undefined1 local_74 [16];
  int local_64;
  undefined8 local_60;
  undefined1 local_58 [12];
  undefined1 local_4c [16];
  int local_3c;
  undefined8 local_38;
  
  local_64 = 0;
  local_80._0_4_ = 0x30;
  local_80._4_4_ = 0x180;
  local_80._8_4_ = 2;
  local_74._0_12_ = ZEXT412(0x1406) << 0x40;
  local_74._12_4_ = 0;
  local_60._0_4_ = -1.0;
  local_60._4_4_ = 1.0;
  local_3c = 0;
  local_58._0_4_ = 0x30;
  local_58._4_4_ = 0x180;
  local_58._8_4_ = 2;
  local_4c._0_12_ = ZEXT412(0x1406) << 0x40;
  local_4c._12_4_ = 0;
  local_38._0_4_ = -1.0;
  local_38._4_4_ = 1.0;
  local_d0.stride = 0;
  local_d0.offset = 0;
  local_d0.floatRangeMin = 0.0;
  local_d0.floatRangeMax = 0.0;
  local_d0.count = 0x30;
  local_d0.size = 0xc0;
  local_d0.componentCount = 2;
  local_d0.type = 0x1402;
  local_d0.intRangeMin = -0x8000;
  local_d0.intRangeMax = 0x8000;
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  local_d8 = (TestNode *)this;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1406;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,(value_type *)local_80);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,(value_type *)local_58);
  local_170[8] = false;
  local_170._0_4_ = 0x30;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar45->bufferNdx = 1;
  pAVar46->bufferNdx = 2;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_buffer",
             "diff_buffer");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1406;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,(value_type *)local_80);
  local_170[8] = false;
  local_170._0_4_ = 0x18;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar45->size = 2;
  pAVar46->size = 3;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_size","diff_size"
            );
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\x01';
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  local_170[8] = false;
  local_170._0_4_ = 0x18;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar46->stride = 2;
  pAVar45->stride = 4;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_stride",
             "diff_stride");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\x01';
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  local_170[8] = false;
  local_170._0_4_ = 0x18;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar46->type = 0x1402;
  pAVar45->type = 0x1400;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_type","diff_type"
            );
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1400;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\0';
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  local_170[8] = false;
  local_170._0_4_ = 0x18;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  local_170._4_4_ = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar45->integer = '\0';
  pAVar46->integer = '\x01';
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_integer",
             "diff_integer");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(undefined1 *)(int *)local_f8._0_8_ = 1;
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(int *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_f8._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_f8._0_8_ + 0x1c) = 1;
  *(float *)(local_f8._0_8_ + 0x20) = 1.4013e-45;
  *(undefined1 *)(local_f8._0_8_ + 0x24) = 1;
  ((value_type *)(local_f8._0_8_ + 0x28))->count = 4;
  ((value_type *)(local_f8._0_8_ + 0x28))->size = 0;
  ((value_type *)(local_f8._0_8_ + 0x28))->componentCount = 0x1406;
  *(undefined1 *)&((value_type *)(local_f8._0_8_ + 0x28))->stride = 0;
  ((value_type *)(local_f8._0_8_ + 0x28))->offset = 0;
  ((value_type *)(local_f8._0_8_ + 0x28))->type = 0;
  *(undefined1 *)&((value_type *)(local_f8._0_8_ + 0x28))->intRangeMin = 0;
  ((value_type *)(local_f8._0_8_ + 0x28))->intRangeMax = 2;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  pvVar47 = (value_type *)local_80;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,pvVar47);
  local_170[8] = false;
  local_170._0_4_ = 0xc;
  local_170._4_4_ = 10;
  uVar38 = local_f8._8_8_;
  pvVar43 = (value_type *)(local_f8._8_8_ - uVar37);
  pAVar46 = (pointer)local_130._0_8_;
  pvVar49 = (value_type *)((long)local_120 - local_130._0_8_);
  if (pvVar49 < pvVar43) {
    pAVar51 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)pvVar43 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar47);
    pAVar45 = pAVar51;
    for (pvVar44 = (value_type *)uVar37; pvVar44 != (value_type *)uVar38;
        pvVar44 = (value_type *)&pvVar44->floatRangeMax) {
      pAVar45->bufferNdx = (int)pvVar44->floatRangeMin;
      uVar1._0_4_ = pvVar44->count;
      uVar1._4_4_ = pvVar44->size;
      iVar35 = pvVar44->componentCount;
      iVar36 = pvVar44->stride;
      uVar2._0_4_ = pvVar44->offset;
      uVar2._4_4_ = pvVar44->type;
      uVar3._0_4_ = pvVar44->intRangeMin;
      uVar3._4_4_ = pvVar44->intRangeMax;
      pAVar45->integer = (char)(undefined4)uVar2;
      *(int3 *)&pAVar45->field_0x11 = (int3)((ulong)uVar2 >> 8);
      pAVar45->divisor = (int)((ulong)uVar2 >> 0x20);
      pAVar45->offset = (undefined4)uVar3;
      pAVar45->normalized = (char)((ulong)uVar3 >> 0x20);
      *(int3 *)&pAVar45->field_0x1d = (int3)((ulong)uVar3 >> 0x28);
      pAVar45->enabled = (char)(undefined4)uVar1;
      *(int3 *)&pAVar45->field_0x1 = (int3)((ulong)uVar1 >> 8);
      pAVar45->size = (int)((ulong)uVar1 >> 0x20);
      pAVar45->stride = iVar35;
      pAVar45->type = iVar36;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,(ulong)pvVar49);
      pvVar47 = pvVar49;
    }
    local_178 = (pointer)((long)pAVar51 + (long)pvVar43);
    pAVar46 = pAVar51;
    local_120 = local_178;
    local_130._0_8_ = pAVar51;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    pvVar49 = (value_type *)(local_130._8_8_ - local_130._0_8_);
    local_178 = local_120;
    if (pvVar49 < pvVar43) {
      if (local_130._8_8_ != local_130._0_8_) {
        pvVar47 = (value_type *)uVar37;
        memmove((void *)local_130._0_8_,(void *)uVar37,(size_t)pvVar49);
      }
      for (pvVar49 = (value_type *)((long)(int *)uVar37 + (long)&pvVar49->count);
          pvVar49 != (value_type *)uVar38; pvVar49 = (value_type *)&pvVar49->floatRangeMax) {
        pAVar45->bufferNdx = (int)pvVar49->floatRangeMin;
        uVar4._0_4_ = pvVar49->count;
        uVar4._4_4_ = pvVar49->size;
        iVar35 = pvVar49->componentCount;
        iVar36 = pvVar49->stride;
        uVar5._0_4_ = pvVar49->offset;
        uVar5._4_4_ = pvVar49->type;
        uVar6._0_4_ = pvVar49->intRangeMin;
        uVar6._4_4_ = pvVar49->intRangeMax;
        pAVar45->integer = (char)(undefined4)uVar5;
        *(int3 *)&pAVar45->field_0x11 = (int3)((ulong)uVar5 >> 8);
        pAVar45->divisor = (int)((ulong)uVar5 >> 0x20);
        pAVar45->offset = (undefined4)uVar6;
        pAVar45->normalized = (char)((ulong)uVar6 >> 0x20);
        *(int3 *)&pAVar45->field_0x1d = (int3)((ulong)uVar6 >> 0x28);
        pAVar45->enabled = (char)(undefined4)uVar4;
        *(int3 *)&pAVar45->field_0x1 = (int3)((ulong)uVar4 >> 8);
        pAVar45->size = (int)((ulong)uVar4 >> 0x20);
        pAVar45->stride = iVar35;
        pAVar45->type = iVar36;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      pvVar47 = (value_type *)uVar37;
      memmove((void *)local_130._0_8_,(void *)uVar37,(size_t)pvVar43);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + (long)pvVar43;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  pvVar49 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar49 < pvVar43) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)pvVar43 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar47);
    pAVar51 = pAVar40;
    for (pvVar47 = (value_type *)uVar37; pvVar47 != (value_type *)uVar38;
        pvVar47 = (value_type *)&pvVar47->floatRangeMax) {
      pAVar51->bufferNdx = (int)pvVar47->floatRangeMin;
      uVar7._0_4_ = pvVar47->count;
      uVar7._4_4_ = pvVar47->size;
      iVar35 = pvVar47->componentCount;
      iVar36 = pvVar47->stride;
      uVar8._0_4_ = pvVar47->offset;
      uVar8._4_4_ = pvVar47->type;
      uVar9._0_4_ = pvVar47->intRangeMin;
      uVar9._4_4_ = pvVar47->intRangeMax;
      pAVar51->integer = (char)(undefined4)uVar8;
      *(int3 *)&pAVar51->field_0x11 = (int3)((ulong)uVar8 >> 8);
      pAVar51->divisor = (int)((ulong)uVar8 >> 0x20);
      pAVar51->offset = (undefined4)uVar9;
      pAVar51->normalized = (char)((ulong)uVar9 >> 0x20);
      *(int3 *)&pAVar51->field_0x1d = (int3)((ulong)uVar9 >> 0x28);
      pAVar51->enabled = (char)(undefined4)uVar7;
      *(int3 *)&pAVar51->field_0x1 = (int3)((ulong)uVar7 >> 8);
      pAVar51->size = (int)((ulong)uVar7 >> 0x20);
      pAVar51->stride = iVar35;
      pAVar51->type = iVar36;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,(ulong)pvVar49);
    }
    pAVar51 = (pointer)((long)pAVar40 + (long)pvVar43);
    pAVar45 = pAVar40;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar40;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    pvVar47 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar47 < pvVar43) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,(size_t)pvVar47);
      }
      for (pvVar47 = (value_type *)((long)(int *)uVar37 + (long)&pvVar47->count);
          pvVar47 != (value_type *)uVar38; pvVar47 = (value_type *)&pvVar47->floatRangeMax) {
        pAVar40->bufferNdx = (int)pvVar47->floatRangeMin;
        uVar10._0_4_ = pvVar47->count;
        uVar10._4_4_ = pvVar47->size;
        iVar35 = pvVar47->componentCount;
        iVar36 = pvVar47->stride;
        uVar11._0_4_ = pvVar47->offset;
        uVar11._4_4_ = pvVar47->type;
        uVar12._0_4_ = pvVar47->intRangeMin;
        uVar12._4_4_ = pvVar47->intRangeMax;
        pAVar40->integer = (char)(undefined4)uVar11;
        *(int3 *)&pAVar40->field_0x11 = (int3)((ulong)uVar11 >> 8);
        pAVar40->divisor = (int)((ulong)uVar11 >> 0x20);
        pAVar40->offset = (undefined4)uVar12;
        pAVar40->normalized = (char)((ulong)uVar12 >> 0x20);
        *(int3 *)&pAVar40->field_0x1d = (int3)((ulong)uVar12 >> 0x28);
        pAVar40->enabled = (char)(undefined4)uVar10;
        *(int3 *)&pAVar40->field_0x1 = (int3)((ulong)uVar10 >> 8);
        pAVar40->size = (int)((ulong)uVar10 >> 0x20);
        pAVar40->stride = iVar35;
        pAVar40->type = iVar36;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,(size_t)pvVar43);
    }
  }
  local_150._8_8_ = &pAVar45->enabled + (long)&pvVar43->count;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar46[1].divisor = 3;
  pAVar45[1].divisor = 2;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_divisor",
             "diff_divisor");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((value_type *)uVar37 != (value_type *)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\x01';
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  local_170[8] = false;
  local_170._0_4_ = 0x18;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    local_178 = local_120;
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar46->offset = 2;
  pAVar45->offset = 4;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_offset",
             "diff_offset");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(GLboolean *)local_f8._0_8_ = '\x01';
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\0';
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\x01';
  *(int *)(local_f8._0_8_ + 0x20) = 1;
  local_e0 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,&local_d0);
  local_170[8] = false;
  local_170._0_4_ = 0x30;
  local_170._4_4_ = 0;
  uVar38 = local_f8._8_8_;
  uVar50 = local_f8._8_8_ - uVar37;
  pAVar46 = (pointer)local_130._0_8_;
  uVar48 = (long)local_120 - local_130._0_8_;
  if (uVar48 < uVar50) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar45 = pAVar40;
    for (pAVar51 = (pointer)uVar37; pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1) {
      pAVar45->bufferNdx = pAVar51->bufferNdx;
      GVar30 = pAVar51->enabled;
      uVar31 = *(undefined3 *)&pAVar51->field_0x1;
      GVar32 = pAVar51->size;
      GVar33 = pAVar51->stride;
      GVar34 = pAVar51->type;
      uVar25 = *(undefined3 *)&pAVar51->field_0x11;
      GVar26 = pAVar51->divisor;
      GVar27 = pAVar51->offset;
      GVar28 = pAVar51->normalized;
      uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
      pAVar45->integer = pAVar51->integer;
      *(undefined3 *)&pAVar45->field_0x11 = uVar25;
      pAVar45->divisor = GVar26;
      pAVar45->offset = GVar27;
      pAVar45->normalized = GVar28;
      *(undefined3 *)&pAVar45->field_0x1d = uVar29;
      pAVar45->enabled = GVar30;
      *(undefined3 *)&pAVar45->field_0x1 = uVar31;
      pAVar45->size = GVar32;
      pAVar45->stride = GVar33;
      pAVar45->type = GVar34;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,uVar48);
    }
    local_178 = (pointer)((long)pAVar40 + uVar50);
    pAVar46 = pAVar40;
    local_120 = local_178;
    local_130._0_8_ = pAVar40;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    uVar48 = local_130._8_8_ - local_130._0_8_;
    local_178 = local_120;
    if (uVar48 < uVar50) {
      if (local_130._8_8_ != local_130._0_8_) {
        memmove((void *)local_130._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar51 = (pointer)(uVar48 + uVar37); pAVar51 != (pointer)uVar38; pAVar51 = pAVar51 + 1)
      {
        pAVar45->bufferNdx = pAVar51->bufferNdx;
        GVar30 = pAVar51->enabled;
        uVar31 = *(undefined3 *)&pAVar51->field_0x1;
        GVar32 = pAVar51->size;
        GVar33 = pAVar51->stride;
        GVar34 = pAVar51->type;
        uVar25 = *(undefined3 *)&pAVar51->field_0x11;
        GVar26 = pAVar51->divisor;
        GVar27 = pAVar51->offset;
        GVar28 = pAVar51->normalized;
        uVar29 = *(undefined3 *)&pAVar51->field_0x1d;
        pAVar45->integer = pAVar51->integer;
        *(undefined3 *)&pAVar45->field_0x11 = uVar25;
        pAVar45->divisor = GVar26;
        pAVar45->offset = GVar27;
        pAVar45->normalized = GVar28;
        *(undefined3 *)&pAVar45->field_0x1d = uVar29;
        pAVar45->enabled = GVar30;
        *(undefined3 *)&pAVar45->field_0x1 = uVar31;
        pAVar45->size = GVar32;
        pAVar45->stride = GVar33;
        pAVar45->type = GVar34;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      memmove((void *)local_130._0_8_,(void *)uVar37,uVar50);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + uVar50;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  uVar48 = (long)local_140 - local_150._0_8_;
  if (uVar48 < uVar50) {
    pAVar41 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)uVar50 >> 2) * -0x71c71c71c71c71c7),uVar37);
    pAVar51 = pAVar41;
    for (pAVar40 = (pointer)uVar37; pAVar40 != (pointer)uVar38; pAVar40 = pAVar40 + 1) {
      pAVar51->bufferNdx = pAVar40->bufferNdx;
      GVar30 = pAVar40->enabled;
      uVar31 = *(undefined3 *)&pAVar40->field_0x1;
      GVar32 = pAVar40->size;
      GVar33 = pAVar40->stride;
      GVar34 = pAVar40->type;
      uVar25 = *(undefined3 *)&pAVar40->field_0x11;
      GVar26 = pAVar40->divisor;
      GVar27 = pAVar40->offset;
      GVar28 = pAVar40->normalized;
      uVar29 = *(undefined3 *)&pAVar40->field_0x1d;
      pAVar51->integer = pAVar40->integer;
      *(undefined3 *)&pAVar51->field_0x11 = uVar25;
      pAVar51->divisor = GVar26;
      pAVar51->offset = GVar27;
      pAVar51->normalized = GVar28;
      *(undefined3 *)&pAVar51->field_0x1d = uVar29;
      pAVar51->enabled = GVar30;
      *(undefined3 *)&pAVar51->field_0x1 = uVar31;
      pAVar51->size = GVar32;
      pAVar51->stride = GVar33;
      pAVar51->type = GVar34;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,uVar48);
    }
    pAVar51 = (pointer)((long)pAVar41 + uVar50);
    pAVar45 = pAVar41;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar41;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    uVar48 = local_150._8_8_ - local_150._0_8_;
    if (uVar48 < uVar50) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,uVar48);
      }
      for (pAVar41 = (pointer)(uVar48 + uVar37); pAVar41 != (pointer)uVar38; pAVar41 = pAVar41 + 1)
      {
        pAVar40->bufferNdx = pAVar41->bufferNdx;
        GVar30 = pAVar41->enabled;
        uVar31 = *(undefined3 *)&pAVar41->field_0x1;
        GVar32 = pAVar41->size;
        GVar33 = pAVar41->stride;
        GVar34 = pAVar41->type;
        uVar25 = *(undefined3 *)&pAVar41->field_0x11;
        GVar26 = pAVar41->divisor;
        GVar27 = pAVar41->offset;
        GVar28 = pAVar41->normalized;
        uVar29 = *(undefined3 *)&pAVar41->field_0x1d;
        pAVar40->integer = pAVar41->integer;
        *(undefined3 *)&pAVar40->field_0x11 = uVar25;
        pAVar40->divisor = GVar26;
        pAVar40->offset = GVar27;
        pAVar40->normalized = GVar28;
        *(undefined3 *)&pAVar40->field_0x1d = uVar29;
        pAVar40->enabled = GVar30;
        *(undefined3 *)&pAVar40->field_0x1 = uVar31;
        pAVar40->size = GVar32;
        pAVar40->stride = GVar33;
        pAVar40->type = GVar34;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,uVar50);
    }
  }
  local_150._8_8_ = uVar50 + (long)pAVar45;
  local_138 = 0;
  iStack_154 = 0;
  stack0xfffffffffffffe9c = (undefined1  [16])0x0;
  pAVar46->normalized = '\x01';
  pAVar45->normalized = '\0';
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_normalize",
             "diff_normalize");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((pointer)uVar37 != (pointer)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  operator_delete(pAVar46,(long)local_178 - (long)pAVar46);
  operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  local_170._0_4_ = -1;
  local_170._4_4_ = -1;
  local_170[8] = false;
  uStack_15c._0_4_ = 0xffffffff;
  local_170._12_8_ = 0xffffffff00000000;
  uStack_15c._4_4_ = 0xffffffff;
  iStack_154 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_118 = -1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = 0xffffffff;
  local_a8.count = local_a8.count & 0xffffff00;
  local_a8.size = 1;
  local_a8.componentCount = 0;
  local_a8.stride = 0x1406;
  local_a8.offset = local_a8.offset & 0xffffff00;
  local_a8.floatRangeMin = 0.0;
  local_a8.type = 0;
  local_a8.intRangeMin = 0;
  local_a8.intRangeMax = local_a8.intRangeMax & 0xffffff00;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_f8,(value_type *)&local_a8);
  uVar37 = local_f8._0_8_;
  *(undefined1 *)(int *)local_f8._0_8_ = 1;
  *(undefined8 *)(local_f8._0_8_ + 4) = 2;
  *(int *)(local_f8._0_8_ + 0xc) = 0x1406;
  *(undefined1 *)(local_f8._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_f8._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_f8._0_8_ + 0x1c) = 1;
  *(float *)(local_f8._0_8_ + 0x20) = 1.4013e-45;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,(value_type *)local_80);
  pvVar47 = &local_a8;
  local_a8.stride = 0;
  local_a8.offset = 0;
  local_a8.intRangeMin = 0;
  local_a8.floatRangeMin = 0.0;
  local_a8.floatRangeMax = 0.0;
  local_a8.count = 0x18;
  local_a8.size = 0xc0;
  local_a8.componentCount = 1;
  local_a8.type = 0x1403;
  local_a8.intRangeMax = 0x30;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_110,pvVar47);
  local_170[8] = true;
  local_170._0_4_ = 0x18;
  uVar38 = local_f8._8_8_;
  pvVar49 = (value_type *)(local_f8._8_8_ - uVar37);
  pAVar46 = (pointer)local_130._0_8_;
  local_188 = local_120;
  pvVar43 = (value_type *)((long)local_120 - local_130._0_8_);
  if (pvVar43 < pvVar49) {
    pAVar51 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)pvVar49 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar47);
    pAVar45 = pAVar51;
    for (pvVar44 = (value_type *)uVar37; pvVar44 != (value_type *)uVar38;
        pvVar44 = (value_type *)&pvVar44->floatRangeMax) {
      pAVar45->bufferNdx = (int)pvVar44->floatRangeMin;
      uVar13._0_4_ = pvVar44->count;
      uVar13._4_4_ = pvVar44->size;
      iVar35 = pvVar44->componentCount;
      iVar36 = pvVar44->stride;
      uVar14._0_4_ = pvVar44->offset;
      uVar14._4_4_ = pvVar44->type;
      uVar15._0_4_ = pvVar44->intRangeMin;
      uVar15._4_4_ = pvVar44->intRangeMax;
      pAVar45->integer = (char)(undefined4)uVar14;
      *(int3 *)&pAVar45->field_0x11 = (int3)((ulong)uVar14 >> 8);
      pAVar45->divisor = (int)((ulong)uVar14 >> 0x20);
      pAVar45->offset = (undefined4)uVar15;
      pAVar45->normalized = (char)((ulong)uVar15 >> 0x20);
      *(int3 *)&pAVar45->field_0x1d = (int3)((ulong)uVar15 >> 0x28);
      pAVar45->enabled = (char)(undefined4)uVar13;
      *(int3 *)&pAVar45->field_0x1 = (int3)((ulong)uVar13 >> 8);
      pAVar45->size = (int)((ulong)uVar13 >> 0x20);
      pAVar45->stride = iVar35;
      pAVar45->type = iVar36;
      pAVar45 = pAVar45 + 1;
    }
    if (pAVar46 != (pointer)0x0) {
      operator_delete(pAVar46,(ulong)pvVar43);
      pvVar47 = pvVar43;
    }
    local_188 = (pointer)((long)pAVar51 + (long)pvVar49);
    pAVar46 = pAVar51;
    local_120 = local_188;
    local_130._0_8_ = pAVar51;
  }
  else {
    pAVar45 = (pointer)local_130._8_8_;
    pvVar43 = (value_type *)(local_130._8_8_ - local_130._0_8_);
    if (pvVar43 < pvVar49) {
      if (local_130._8_8_ != local_130._0_8_) {
        pvVar47 = (value_type *)uVar37;
        memmove((void *)local_130._0_8_,(void *)uVar37,(size_t)pvVar43);
      }
      for (pvVar43 = (value_type *)((long)(int *)uVar37 + (long)&pvVar43->count);
          pvVar43 != (value_type *)uVar38; pvVar43 = (value_type *)&pvVar43->floatRangeMax) {
        pAVar45->bufferNdx = (int)pvVar43->floatRangeMin;
        uVar16._0_4_ = pvVar43->count;
        uVar16._4_4_ = pvVar43->size;
        iVar35 = pvVar43->componentCount;
        iVar36 = pvVar43->stride;
        uVar17._0_4_ = pvVar43->offset;
        uVar17._4_4_ = pvVar43->type;
        uVar18._0_4_ = pvVar43->intRangeMin;
        uVar18._4_4_ = pvVar43->intRangeMax;
        pAVar45->integer = (char)(undefined4)uVar17;
        *(int3 *)&pAVar45->field_0x11 = (int3)((ulong)uVar17 >> 8);
        pAVar45->divisor = (int)((ulong)uVar17 >> 0x20);
        pAVar45->offset = (undefined4)uVar18;
        pAVar45->normalized = (char)((ulong)uVar18 >> 0x20);
        *(int3 *)&pAVar45->field_0x1d = (int3)((ulong)uVar18 >> 0x28);
        pAVar45->enabled = (char)(undefined4)uVar16;
        *(int3 *)&pAVar45->field_0x1 = (int3)((ulong)uVar16 >> 8);
        pAVar45->size = (int)((ulong)uVar16 >> 0x20);
        pAVar45->stride = iVar35;
        pAVar45->type = iVar36;
        pAVar45 = pAVar45 + 1;
      }
    }
    else if (local_f8._8_8_ != uVar37) {
      pvVar47 = (value_type *)uVar37;
      memmove((void *)local_130._0_8_,(void *)uVar37,(size_t)pvVar49);
    }
  }
  pAVar51 = local_140;
  local_130._8_8_ = (long)pAVar46 + (long)pvVar49;
  local_118 = 0;
  pAVar45 = (pointer)local_150._0_8_;
  pvVar43 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar43 < pvVar49) {
    pAVar40 = std::
              _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             *)(((long)pvVar49 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar47);
    pAVar51 = pAVar40;
    for (pvVar47 = (value_type *)uVar37; pvVar47 != (value_type *)uVar38;
        pvVar47 = (value_type *)&pvVar47->floatRangeMax) {
      pAVar51->bufferNdx = (int)pvVar47->floatRangeMin;
      uVar19._0_4_ = pvVar47->count;
      uVar19._4_4_ = pvVar47->size;
      iVar35 = pvVar47->componentCount;
      iVar36 = pvVar47->stride;
      uVar20._0_4_ = pvVar47->offset;
      uVar20._4_4_ = pvVar47->type;
      uVar21._0_4_ = pvVar47->intRangeMin;
      uVar21._4_4_ = pvVar47->intRangeMax;
      pAVar51->integer = (char)(undefined4)uVar20;
      *(int3 *)&pAVar51->field_0x11 = (int3)((ulong)uVar20 >> 8);
      pAVar51->divisor = (int)((ulong)uVar20 >> 0x20);
      pAVar51->offset = (undefined4)uVar21;
      pAVar51->normalized = (char)((ulong)uVar21 >> 0x20);
      *(int3 *)&pAVar51->field_0x1d = (int3)((ulong)uVar21 >> 0x28);
      pAVar51->enabled = (char)(undefined4)uVar19;
      *(int3 *)&pAVar51->field_0x1 = (int3)((ulong)uVar19 >> 8);
      pAVar51->size = (int)((ulong)uVar19 >> 0x20);
      pAVar51->stride = iVar35;
      pAVar51->type = iVar36;
      pAVar51 = pAVar51 + 1;
    }
    if (pAVar45 != (pointer)0x0) {
      operator_delete(pAVar45,(ulong)pvVar43);
    }
    pAVar51 = (pointer)((long)pAVar40 + (long)pvVar49);
    pAVar45 = pAVar40;
    local_140 = pAVar51;
    local_150._0_8_ = pAVar40;
  }
  else {
    pAVar40 = (pointer)local_150._8_8_;
    pvVar47 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar47 < pvVar49) {
      if (local_150._8_8_ != local_150._0_8_) {
        memmove((void *)local_150._0_8_,(void *)uVar37,(size_t)pvVar47);
      }
      for (pvVar47 = (value_type *)((long)(int *)uVar37 + (long)&pvVar47->count);
          pvVar47 != (value_type *)uVar38; pvVar47 = (value_type *)&pvVar47->floatRangeMax) {
        pAVar40->bufferNdx = (int)pvVar47->floatRangeMin;
        uVar22._0_4_ = pvVar47->count;
        uVar22._4_4_ = pvVar47->size;
        iVar35 = pvVar47->componentCount;
        iVar36 = pvVar47->stride;
        uVar23._0_4_ = pvVar47->offset;
        uVar23._4_4_ = pvVar47->type;
        uVar24._0_4_ = pvVar47->intRangeMin;
        uVar24._4_4_ = pvVar47->intRangeMax;
        pAVar40->integer = (char)(undefined4)uVar23;
        *(int3 *)&pAVar40->field_0x11 = (int3)((ulong)uVar23 >> 8);
        pAVar40->divisor = (int)((ulong)uVar23 >> 0x20);
        pAVar40->offset = (undefined4)uVar24;
        pAVar40->normalized = (char)((ulong)uVar24 >> 0x20);
        *(int3 *)&pAVar40->field_0x1d = (int3)((ulong)uVar24 >> 0x28);
        pAVar40->enabled = (char)(undefined4)uVar22;
        *(int3 *)&pAVar40->field_0x1 = (int3)((ulong)uVar22 >> 8);
        pAVar40->size = (int)((ulong)uVar22 >> 0x20);
        pAVar40->stride = iVar35;
        pAVar40->type = iVar36;
        pAVar40 = pAVar40 + 1;
      }
    }
    else if (uVar38 != uVar37) {
      memmove((void *)local_150._0_8_,(void *)uVar37,(size_t)pvVar49);
    }
  }
  local_150._8_8_ = &pAVar45->enabled + (long)&pvVar49->count;
  local_170._4_4_ = 0;
  uStack_15c = 0x3000000000;
  local_170._12_8_ = 0x1403;
  iStack_154 = 0x18;
  local_138 = 0;
  local_118 = 2;
  pVVar42 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar39 = local_d8;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar42,(Context *)local_d8[1]._vptr_TestNode,(Spec *)local_170,"diff_indices",
             "diff_indices");
  tcu::TestNode::addChild(pTVar39,(TestNode *)pVVar42);
  if ((value_type *)uVar37 != (value_type *)0x0) {
    operator_delete((void *)uVar37,(long)local_e8 - uVar37);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_,(long)local_100 - local_110._0_8_);
  }
  pTVar39 = local_d8;
  if (pAVar46 != (pointer)0x0) {
    operator_delete(pAVar46,(long)local_188 - (long)pAVar46);
  }
  if (pAVar45 != (pointer)0x0) {
    operator_delete(pAVar45,(long)pAVar51 - (long)pAVar45);
  }
  this_00 = (MultiVertexArrayObjectTest *)operator_new(0x138);
  MultiVertexArrayObjectTest::MultiVertexArrayObjectTest
            (this_00,(Context *)pTVar39[1]._vptr_TestNode,"all_attributes","all_attributes");
  tcu::TestNode::addChild(pTVar39,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void VertexArrayObjectTestGroup::init (void)
{
	BufferSpec floatCoordBuffer48_1 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };
	BufferSpec floatCoordBuffer48_2 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };

	BufferSpec shortCoordBuffer48 = { 48, 192, 2, 0, 0, GL_SHORT, -32768, 32768, 0.0f, 0.0f };

	// Different buffer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);
		spec.buffers.push_back(floatCoordBuffer48_2);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].bufferNdx	= 1;
		spec.vao.attributes[0].bufferNdx	= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_buffer", "diff_buffer"));
	}
	// Different size
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].size		= 2;
		spec.vao.attributes[0].size			= 3;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_size", "diff_size"));
	}

	// Different stride
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].stride	= 2;
		spec.state.attributes[0].stride	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_stride", "diff_stride"));
	}

	// Different types
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].type		= GL_SHORT;
		spec.state.attributes[0].type	= GL_BYTE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_type", "diff_type"));
	}
	// Different "integer"
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_BYTE;
		state.attributes[0].integer		= GL_TRUE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].integer	= GL_FALSE;
		spec.vao.attributes[0].integer		= GL_TRUE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_integer", "diff_integer"));
	}
	// Different divisor
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());
		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.attributes[1].enabled		= true;
		state.attributes[1].size		= 4;
		state.attributes[1].stride		= 0;
		state.attributes[1].type		= GL_FLOAT;
		state.attributes[1].integer		= GL_FALSE;
		state.attributes[1].divisor		= 0;
		state.attributes[1].offset		= 0;
		state.attributes[1].normalized	= GL_FALSE;
		state.attributes[1].bufferNdx	= 2;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);
		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 10;
		spec.count				= 12;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[1].divisor		= 3;
		spec.state.attributes[1].divisor	= 2;

		addChild(new VertexArrayObjectTest(m_context, spec, "diff_divisor", "diff_divisor"));
	}
	// Different offset
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].offset	= 2;
		spec.state.attributes[0].offset	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_offset", "diff_offset"));
	}
	// Different normalize
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].normalized	= GL_TRUE;
		spec.state.attributes[0].normalized	= GL_FALSE;;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_normalize", "diff_normalize"));
	}
	// DrawElements with buffer / Pointer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		BufferSpec indexBuffer = { 24, 192, 1, 0, 0, GL_UNSIGNED_SHORT, 0, 48, 0.0f, 0.0f };
		spec.buffers.push_back(indexBuffer);

		spec.useDrawElements	= true;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 48;
		spec.indexType			= GL_UNSIGNED_SHORT;
		spec.indexCount			= 24;

		spec.state.elementArrayBuffer	= 0;
		spec.vao.elementArrayBuffer		= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_indices", "diff_indices"));
	}
	// Use all attributes

	addChild(new MultiVertexArrayObjectTest(m_context, "all_attributes", "all_attributes"));
}